

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           *this,key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> *key)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  EnumDescriptor *pEVar5;
  uint uVar6;
  long lVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  bool bVar24;
  undefined1 *puVar25;
  ushort uVar26;
  uint64_t v;
  ctrl_t *pcVar27;
  slot_type *ppEVar28;
  anon_union_8_1_a8a14541_for_iterator_2 aVar29;
  uintptr_t v_2;
  undefined1 (*pauVar30) [16];
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  undefined1 uVar31;
  ulong uVar32;
  ulong uVar33;
  uint64_t v_9;
  uint uVar34;
  uintptr_t v_6;
  uint64_t v_13;
  uintptr_t v_10;
  undefined1 *unaff_R13;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  iterator iVar39;
  iterator iVar40;
  __m128i match;
  ulong local_80;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  
  AssertNotDebugCapacity(this);
  if (1 < (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    pvVar3 = (key->query).first;
    uVar35 = ((ulong)pvVar3 ^ 0x589848) * -0x234dd359734ecb13;
    uVar35 = ((uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
               (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
               (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28
              | uVar35 << 0x38) ^ (ulong)pvVar3) * -0x234dd359734ecb13;
    uVar32 = (uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
              (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
              (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 | (uVar35 & 0xff00) << 0x28 |
             uVar35 << 0x38) ^ (ulong)(uint)(key->query).second;
    uVar35 = (this->settings_).
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    if (uVar35 == 1) {
      ppEVar28 = soo_slot(this);
      pEVar5 = (*ppEVar28)->type_;
      if ((pEVar5 == (EnumDescriptor *)(key->query).first) &&
         (uVar34 = (*ppEVar28)->number_, uVar34 == (key->query).second)) {
        uVar35 = ((ulong)pEVar5 ^ 0x589848) * -0x234dd359734ecb13;
        uVar35 = ((uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                   (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                   (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                   (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38) ^ (ulong)pEVar5) *
                 -0x234dd359734ecb13;
        if (uVar32 != ((uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                        (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                        (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                        (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38) ^ (ulong)uVar34)) {
LAB_001d8c39:
          __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfbf,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::AssertHashEqConsistent(const google::protobuf::(anonymous namespace)::ParentNumberQuery &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                       );
        }
      }
    }
    else {
      if (uVar35 == 0) goto LAB_001d8d7e;
      if (uVar35 < 0x11) {
        ppEVar28 = slot_array(this);
        uVar35 = (this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar30 = (undefined1 (*) [16])
                   (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar35 < 0xf) {
          if (8 < uVar35) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          uVar35 = *(ulong *)(*pauVar30 + uVar35) & 0x8080808080808080;
          if (uVar35 != 0x8080808080808080) {
            uVar35 = uVar35 ^ 0x8080808080808080;
            do {
              lVar7 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              lVar7 = *(long *)((long)ppEVar28 + ((ulong)((uint)lVar7 & 0xfffffff8) - 8));
              pvVar3 = *(void **)(lVar7 + 0x10);
              if ((pvVar3 == (key->query).first) &&
                 (uVar34 = *(uint *)(lVar7 + 4), uVar34 == (key->query).second)) {
                uVar33 = ((ulong)pvVar3 ^ 0x589848) * -0x234dd359734ecb13;
                uVar33 = ((uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                           (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8 |
                           (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 |
                           (uVar33 & 0xff00) << 0x28 | uVar33 << 0x38) ^ (ulong)pvVar3) *
                         -0x234dd359734ecb13;
                if (uVar32 != ((uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                                (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8 |
                                (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 |
                                (uVar33 & 0xff00) << 0x28 | uVar33 << 0x38) ^ (ulong)uVar34))
                goto LAB_001d8c39;
              }
              uVar35 = uVar35 & uVar35 - 1;
            } while (uVar35 != 0);
          }
        }
        else {
          uVar35 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar35) {
            uVar35 = uVar35 >> 1;
            while( true ) {
              auVar36 = *pauVar30;
              uVar34 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar36[0xf] >> 7) << 0xf);
              if (uVar34 != 0xffff) {
                uVar34 = ~uVar34;
                do {
                  uVar6 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  if ((char)(*pauVar30)[uVar6] < '\0') {
                    __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x79d,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                                 );
                  }
                  pEVar5 = ppEVar28[uVar6]->type_;
                  if ((pEVar5 == (EnumDescriptor *)(key->query).first) &&
                     (uVar6 = ppEVar28[uVar6]->number_, uVar6 == (key->query).second)) {
                    uVar33 = ((ulong)pEVar5 ^ 0x589848) * -0x234dd359734ecb13;
                    uVar33 = ((uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                               (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8 |
                               (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 |
                               (uVar33 & 0xff00) << 0x28 | uVar33 << 0x38) ^ (ulong)pEVar5) *
                             -0x234dd359734ecb13;
                    if (uVar32 != ((uVar33 >> 0x38 | (uVar33 & 0xff000000000000) >> 0x28 |
                                    (uVar33 & 0xff0000000000) >> 0x18 | (uVar33 & 0xff00000000) >> 8
                                    | (uVar33 & 0xff000000) << 8 | (uVar33 & 0xff0000) << 0x18 |
                                    (uVar33 & 0xff00) << 0x28 | uVar33 << 0x38) ^ (ulong)uVar6))
                    goto LAB_001d8c39;
                  }
                  uVar35 = uVar35 - 1;
                  uVar26 = (ushort)(uVar34 - 1) & (ushort)uVar34;
                  uVar34 = CONCAT22((short)(uVar34 - 1 >> 0x10),uVar26);
                } while (uVar26 != 0);
              }
              if (uVar35 == 0) break;
              ppEVar28 = ppEVar28 + 0x10;
              puVar25 = *pauVar30;
              pauVar30 = pauVar30 + 1;
              if (puVar25[0xf] == -1) {
                __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7a5,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::EnumValueDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
            }
          }
        }
      }
    }
  }
  AssertNotDebugCapacity(this);
  sVar2 = (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar2 != 1) {
    if (sVar2 != 0) {
      prefetch_heap_block(this);
      uVar35 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar35 == 1) {
        __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe2a,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                     );
      }
      if (uVar35 != 0) {
        if ((uVar35 + 1 & uVar35) != 0) {
          __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x14c,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        pvVar3 = (key->query).first;
        uVar32 = ((ulong)pvVar3 ^ 0x589848) * -0x234dd359734ecb13;
        uVar32 = ((uVar32 >> 0x38 | (uVar32 & 0xff000000000000) >> 0x28 |
                   (uVar32 & 0xff0000000000) >> 0x18 | (uVar32 & 0xff00000000) >> 8 |
                   (uVar32 & 0xff000000) << 8 | (uVar32 & 0xff0000) << 0x18 |
                   (uVar32 & 0xff00) << 0x28 | uVar32 << 0x38) ^ (ulong)pvVar3) *
                 -0x234dd359734ecb13;
        uVar32 = ((uVar32 >> 0x38 | (uVar32 & 0xff000000000000) >> 0x28 |
                   (uVar32 & 0xff0000000000) >> 0x18 | (uVar32 & 0xff00000000) >> 8 |
                   (uVar32 & 0xff000000) << 8 | (uVar32 & 0xff0000) << 0x18 |
                   (uVar32 & 0xff00) << 0x28 | uVar32 << 0x38) ^ (ulong)(uint)(key->query).second) *
                 -0x234dd359734ecb13;
        local_80 = ((uVar32 >> 0x38 | (uVar32 & 0xff000000000000) >> 0x28 |
                     (uVar32 & 0xff0000000000) >> 0x18 | (uVar32 & 0xff00000000) >> 8 |
                     (uVar32 & 0xff000000) << 8 | (uVar32 & 0xff0000) << 0x18 |
                     (uVar32 & 0xff00) << 0x28 | uVar32 << 0x38) >> 7 ^
                   (ulong)(this->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control >> 0xc) & uVar35;
        pcVar27 = control(this);
        uVar31 = (undefined1)(uVar32 >> 0x38);
        auVar36 = ZEXT216(CONCAT11(uVar31,uVar31) & 0x7f7f);
        auVar36 = pshuflw(auVar36,auVar36,0);
        uVar32 = 0;
        aVar29 = (anon_union_8_1_a8a14541_for_iterator_2)key;
        do {
          iVar39.field_1.slot_ = aVar29.slot_;
          iVar39.ctrl_ = unaff_R13;
          pcVar1 = pcVar27 + local_80;
          cVar8 = *pcVar1;
          cVar9 = pcVar1[1];
          cVar10 = pcVar1[2];
          cVar11 = pcVar1[3];
          cVar12 = pcVar1[4];
          cVar13 = pcVar1[5];
          cVar14 = pcVar1[6];
          cVar15 = pcVar1[7];
          cVar16 = pcVar1[8];
          cVar17 = pcVar1[9];
          cVar18 = pcVar1[10];
          cVar19 = pcVar1[0xb];
          cVar20 = pcVar1[0xc];
          cVar21 = pcVar1[0xd];
          cVar22 = pcVar1[0xe];
          cVar23 = pcVar1[0xf];
          local_58 = auVar36[0];
          cStack_57 = auVar36[1];
          cStack_56 = auVar36[2];
          cStack_55 = auVar36[3];
          auVar37[0] = -(local_58 == cVar8);
          auVar37[1] = -(cStack_57 == cVar9);
          auVar37[2] = -(cStack_56 == cVar10);
          auVar37[3] = -(cStack_55 == cVar11);
          auVar37[4] = -(local_58 == cVar12);
          auVar37[5] = -(cStack_57 == cVar13);
          auVar37[6] = -(cStack_56 == cVar14);
          auVar37[7] = -(cStack_55 == cVar15);
          auVar37[8] = -(local_58 == cVar16);
          auVar37[9] = -(cStack_57 == cVar17);
          auVar37[10] = -(cStack_56 == cVar18);
          auVar37[0xb] = -(cStack_55 == cVar19);
          auVar37[0xc] = -(local_58 == cVar20);
          auVar37[0xd] = -(cStack_57 == cVar21);
          auVar37[0xe] = -(cStack_56 == cVar22);
          auVar37[0xf] = -(cStack_55 == cVar23);
          uVar26 = (ushort)(SUB161(auVar37 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar37[0xf] >> 7) << 0xf;
          uVar34 = (uint)uVar26;
          while (uVar26 != 0) {
            uVar6 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            ppEVar28 = slot_array(this);
            uVar33 = uVar6 + local_80 & uVar35;
            if (ppEVar28[uVar33]->number_ == (key->query).second &&
                ppEVar28[uVar33]->type_ == (EnumDescriptor *)(key->query).first) {
              iVar39 = iterator_at(this,uVar33);
              break;
            }
            uVar26 = (ushort)(uVar34 - 1) & (ushort)uVar34;
            uVar34 = CONCAT22((short)(uVar34 - 1 >> 0x10),uVar26);
          }
          aVar29 = iVar39.field_1;
          unaff_R13 = iVar39.ctrl_;
          if (uVar26 != 0) {
LAB_001d8a82:
            bVar24 = false;
            uVar33 = uVar32;
          }
          else {
            auVar38[0] = -(cVar8 == kEmpty);
            auVar38[1] = -(cVar9 == kEmpty);
            auVar38[2] = -(cVar10 == kEmpty);
            auVar38[3] = -(cVar11 == kEmpty);
            auVar38[4] = -(cVar12 == kEmpty);
            auVar38[5] = -(cVar13 == kEmpty);
            auVar38[6] = -(cVar14 == kEmpty);
            auVar38[7] = -(cVar15 == kEmpty);
            auVar38[8] = -(cVar16 == kEmpty);
            auVar38[9] = -(cVar17 == kEmpty);
            auVar38[10] = -(cVar18 == kEmpty);
            auVar38[0xb] = -(cVar19 == kEmpty);
            auVar38[0xc] = -(cVar20 == kEmpty);
            auVar38[0xd] = -(cVar21 == kEmpty);
            auVar38[0xe] = -(cVar22 == kEmpty);
            auVar38[0xf] = -(cVar23 == kEmpty);
            if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar38 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar38 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar38 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar38 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar38 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar38 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                cVar23 == kEmpty) {
              AssertNotDebugCapacity(this);
              unaff_R13 = (ctrl_t *)0x0;
              goto LAB_001d8a82;
            }
            uVar4 = (this->settings_).
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_;
            if (uVar4 == 0) goto LAB_001d8d7e;
            uVar33 = uVar32 + 0x10;
            if (uVar4 < uVar33) {
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe37,
                            "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                           );
            }
            local_80 = local_80 + uVar32 + 0x10 & uVar35;
            bVar24 = true;
          }
          uVar32 = uVar33;
        } while (bVar24);
        goto LAB_001d8c8f;
      }
    }
LAB_001d8d7e:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  AssertNotDebugCapacity(this);
  if (1 < (this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    ppEVar28 = soo_slot(this);
    if (((*ppEVar28)->type_ == (EnumDescriptor *)(key->query).first) &&
       ((*ppEVar28)->number_ == (key->query).second)) {
      aVar29.slot_ = soo_slot(this);
      unaff_R13 = kSooControl;
      goto LAB_001d8c8f;
    }
  }
  AssertNotDebugCapacity(this);
  unaff_R13 = (ctrl_t *)0x0;
  aVar29 = extraout_RDX;
LAB_001d8c8f:
  iVar40.field_1.slot_ = aVar29.slot_;
  iVar40.ctrl_ = unaff_R13;
  return iVar40;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }